

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O0

bool MallocBlock::MemoryStats(int *blocks,size_t *total,int *histogram)

{
  AllocMap *this;
  anon_class_1_0_00000001 local_31;
  FunctionRef<void_(const_void_*,_int_*)> local_30;
  int *local_20;
  int *histogram_local;
  size_t *total_local;
  int *blocks_local;
  
  local_20 = histogram;
  histogram_local = (int *)total;
  total_local = (size_t *)blocks;
  memset(histogram,0,0x100);
  SpinLock::Lock(&alloc_map_lock_);
  this = alloc_map_;
  stats_blocks_ = 0;
  stats_total_ = 0;
  stats_histogram_ = local_20;
  if (alloc_map_ != (AllocMap *)0x0) {
    tcmalloc::FunctionRef<void(void_const*,int*)>::
    FunctionRef<MallocBlock::MemoryStats(int*,unsigned_long*,int*)::_lambda(void_const*,int*)_1_,void>
              ((FunctionRef<void(void_const*,int*)> *)&local_30,&local_31);
    AddressMap<int>::Iterate(this,local_30);
  }
  *(int *)total_local = stats_blocks_;
  *(size_t *)histogram_local = stats_total_;
  SpinLock::Unlock(&alloc_map_lock_);
  return true;
}

Assistant:

static bool MemoryStats(int* blocks, size_t* total,
                          int histogram[kMallocHistogramSize]) {
    memset(histogram, 0, kMallocHistogramSize * sizeof(int));
    alloc_map_lock_.Lock();
    stats_blocks_ = 0;
    stats_total_ = 0;
    stats_histogram_ = histogram;

    if (alloc_map_) {
      alloc_map_->Iterate([] (const void* ptr, int* type) {
        if ((*type & kDeallocatedTypeBit) == 0) {
          const MallocBlock* b = FromRawPointer(ptr);
          b->CheckLocked(*type);
          ++stats_blocks_;
          size_t mysize = b->size1_;
          int entry = 0;
          stats_total_ += mysize;
          while (mysize) {
            ++entry;
            mysize >>= 1;
          }
          RAW_CHECK(entry < kMallocHistogramSize,
                    "kMallocHistogramSize should be at least as large as log2 "
                    "of the maximum process memory size");
          stats_histogram_[entry] += 1;
        }
      });
    }

    *blocks = stats_blocks_;
    *total = stats_total_;
    alloc_map_lock_.Unlock();
    return true;
  }